

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmartPtr.hpp
# Opt level: O0

SmartPtr<Indexing::IndexManager> * __thiscall
Lib::SmartPtr<Indexing::IndexManager>::operator=
          (SmartPtr<Indexing::IndexManager> *this,SmartPtr<Indexing::IndexManager> *ptr)

{
  IndexManager *pIVar1;
  RefCounter *ptr_00;
  undefined8 *in_RSI;
  SmartPtr<Indexing::IndexManager> *in_RDI;
  RefCounter *oldCnt;
  IndexManager *oldObj;
  size_t in_stack_ffffffffffffffc8;
  IndexManager *in_stack_ffffffffffffffd0;
  
  pIVar1 = in_RDI->_obj;
  ptr_00 = in_RDI->_refCnt;
  in_RDI->_obj = (IndexManager *)*in_RSI;
  in_RDI->_refCnt = (RefCounter *)in_RSI[1];
  if ((in_RDI->_obj != (IndexManager *)0x0) && (in_RDI->_refCnt != (RefCounter *)0x0)) {
    in_RDI->_refCnt->_val = in_RDI->_refCnt->_val + 1;
  }
  if ((((pIVar1 != (IndexManager *)0x0) && (ptr_00 != (RefCounter *)0x0)) &&
      (ptr_00->_val = ptr_00->_val + -1, ptr_00->_val == 0)) &&
     (checked_delete<Indexing::IndexManager>(in_stack_ffffffffffffffd0), ptr_00 != (RefCounter *)0x0
     )) {
    RefCounter::operator_delete(ptr_00,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

SmartPtr& operator=(const SmartPtr& ptr)
  {
    T* oldObj=_obj;
    RefCounter* oldCnt=_refCnt;
    _obj=ptr._obj;
    _refCnt=ptr._refCnt;

    if(_obj && _refCnt) {
      (_refCnt->_val)++;
    }

    if(oldObj && oldCnt) {
      (oldCnt->_val)--;
      ASS(oldCnt->_val >= 0);
      if(! oldCnt->_val) {
        checked_delete(oldObj);
        delete oldCnt;
      }
    }
    return *this;
  }